

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O1

Promise<void> __thiscall kj::anon_unknown_123::AsyncPipe::whenWriteDisconnected(AsyncPipe *this)

{
  WeakFulfillerBase *pWVar1;
  undefined8 *puVar2;
  long *plVar3;
  OwnPromiseNode node;
  WeakFulfiller<void> *params;
  long in_RSI;
  ForkedPromise<void> fork;
  PromiseBase local_70;
  undefined8 local_68;
  OwnPromiseNode local_60;
  WeakFulfillerBase *local_58;
  long *local_50;
  char *local_48;
  char *pcStack_40;
  undefined8 local_38;
  
  if (*(char *)(in_RSI + 0x38) == '\x01') {
    kj::_::readyNow();
    (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
    _vptr_AsyncInputStream = (_func_int **)local_60.ptr;
  }
  else if (*(char *)(in_RSI + 0x50) == '\x01') {
    kj::_::ForkHub<kj::_::Void>::addBranch((ForkHub<kj::_::Void> *)this);
  }
  else {
    params = (WeakFulfiller<void> *)operator_new(0x18);
    pWVar1 = &params->super_WeakFulfillerBase;
    (params->super_WeakFulfillerBase).inner = (PromiseRejector *)0x0;
    (params->super_PromiseFulfiller<void>).super_PromiseRejector._vptr_PromiseRejector =
         (_func_int **)&PTR_reject_00629ab8;
    (params->super_WeakFulfillerBase).super_Disposer._vptr_Disposer =
         (_func_int **)&PTR_disposeImpl_00629af0;
    kj::_::PromiseDisposer::
    alloc<kj::_::AdapterPromiseNode<kj::_::Void,kj::_::PromiseAndFulfillerAdapter<void>>,kj::_::PromiseDisposer,kj::_::WeakFulfiller<void>&>
              ((PromiseDisposer *)&local_70,params);
    local_60.ptr = (PromiseNode *)local_70.node.ptr;
    local_50 = (long *)0x0;
    puVar2 = *(undefined8 **)(in_RSI + 0x40);
    plVar3 = *(long **)(in_RSI + 0x48);
    *(WeakFulfillerBase **)(in_RSI + 0x40) = pWVar1;
    *(WeakFulfiller<void> **)(in_RSI + 0x48) = params;
    local_58 = pWVar1;
    if (plVar3 != (long *)0x0) {
      (**(code **)*puVar2)(puVar2,(long)plVar3 + *(long *)(*plVar3 + -0x10));
    }
    local_48 = 
    "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
    ;
    pcStack_40 = "whenWriteDisconnected";
    local_38 = 0x130000017f;
    Promise<void>::fork((Promise<void> *)&local_70);
    kj::_::ForkHub<kj::_::Void>::addBranch((ForkHub<kj::_::Void> *)this);
    if (*(char *)(in_RSI + 0x50) == '\x01') {
      *(undefined1 *)(in_RSI + 0x50) = 0;
      plVar3 = *(long **)(in_RSI + 0x60);
      if (plVar3 != (long *)0x0) {
        *(undefined8 *)(in_RSI + 0x60) = 0;
        (**(code **)**(undefined8 **)(in_RSI + 0x58))
                  (*(undefined8 **)(in_RSI + 0x58),(long)plVar3 + *(long *)(*plVar3 + -0x10));
      }
    }
    plVar3 = local_50;
    ((OwnPromiseNode *)(in_RSI + 0x58))->ptr = (PromiseNode *)local_70.node.ptr;
    *(undefined8 *)(in_RSI + 0x60) = local_68;
    local_68 = 0;
    *(undefined1 *)(in_RSI + 0x50) = 1;
    if (local_50 != (long *)0x0) {
      local_50 = (long *)0x0;
      (**(local_58->super_Disposer)._vptr_Disposer)
                (local_58,(long)plVar3 + *(long *)(*plVar3 + -0x10));
    }
    node.ptr = (PromiseNode *)local_60;
    if (&(local_60.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
      local_60.ptr = (PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose(&(node.ptr)->super_PromiseArenaMember);
    }
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<void> whenWriteDisconnected() override {
    if (readAborted) {
      return kj::READY_NOW;
    } else KJ_IF_SOME(p, readAbortPromise) {
      return p.addBranch();
    } else {
      auto paf = newPromiseAndFulfiller<void>();
      readAbortFulfiller = kj::mv(paf.fulfiller);
      auto fork = paf.promise.fork();
      auto result = fork.addBranch();
      readAbortPromise = kj::mv(fork);
      return result;
    }